

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void adjustContextSelectionsForCell
               (PaintContext *cell_context,QTextTableCell *cell,int r,int c,int *selectedTableCells)

{
  QList<QAbstractTextDocumentLayout::Selection> *this;
  int iVar1;
  int iVar2;
  pointer pSVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  
  this = &cell_context->selections;
  piVar4 = selectedTableCells + 3;
  lVar5 = 0;
  for (uVar6 = 0; uVar6 < (ulong)(cell_context->selections).d.size; uVar6 = uVar6 + 1) {
    iVar1 = piVar4[-3];
    if (iVar1 != -1) {
      if ((((r < iVar1) || (iVar1 + piVar4[-1] <= r)) || (c < piVar4[-2])) ||
         (piVar4[-2] + *piVar4 <= c)) {
        pSVar3 = QList<QAbstractTextDocumentLayout::Selection>::data(this);
        QTextCursor::clearSelection((QTextCursor *)((long)&(pSVar3->cursor).d.d.ptr + lVar5));
      }
      else {
        iVar1 = QTextTableCell::firstPosition(cell);
        iVar2 = QTextTableCell::lastPosition(cell);
        pSVar3 = QList<QAbstractTextDocumentLayout::Selection>::data(this);
        QTextCursor::setPosition
                  ((QTextCursor *)((long)&(pSVar3->cursor).d.d.ptr + lVar5),iVar1,MoveAnchor);
        pSVar3 = QList<QAbstractTextDocumentLayout::Selection>::data(this);
        QTextCursor::setPosition
                  ((QTextCursor *)((long)&(pSVar3->cursor).d.d.ptr + lVar5),
                   (uint)(iVar1 == iVar2) + iVar2,KeepAnchor);
      }
    }
    pSVar3 = QList<QAbstractTextDocumentLayout::Selection>::data(this);
    QTextFormat::clearProperty
              ((QTextFormat *)((long)&(pSVar3->format).super_QTextFormat.d.d.ptr + lVar5),0x6000);
    piVar4 = piVar4 + 4;
    lVar5 = lVar5 + 0x18;
  }
  return;
}

Assistant:

static void adjustContextSelectionsForCell(QAbstractTextDocumentLayout::PaintContext &cell_context,
                                           const QTextTableCell &cell,
                                           int r, int c,
                                           const int *selectedTableCells)
{
    for (int i = 0; i < cell_context.selections.size(); ++i) {
        int row_start = selectedTableCells[i * 4];
        int col_start = selectedTableCells[i * 4 + 1];
        int num_rows = selectedTableCells[i * 4 + 2];
        int num_cols = selectedTableCells[i * 4 + 3];

        if (row_start != -1) {
            if (r >= row_start && r < row_start + num_rows
                && c >= col_start && c < col_start + num_cols)
            {
                int firstPosition = cell.firstPosition();
                int lastPosition = cell.lastPosition();

                // make sure empty cells are still selected
                if (firstPosition == lastPosition)
                    ++lastPosition;

                cell_context.selections[i].cursor.setPosition(firstPosition);
                cell_context.selections[i].cursor.setPosition(lastPosition, QTextCursor::KeepAnchor);
            } else {
                cell_context.selections[i].cursor.clearSelection();
            }
        }

        // FullWidthSelection is not useful for tables
        cell_context.selections[i].format.clearProperty(QTextFormat::FullWidthSelection);
    }
}